

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ParameterValueAssignmentSyntax *args_4;
  HierarchyInstantiationSyntax *pHVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000058;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000060;
  BumpAllocator *in_stack_000000f8;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  ParameterValueAssignmentSyntax *in_stack_ffffffffffffffb0;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000060,in_stack_00000058);
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  if ((((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)((long)__fn + 0x38))->
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr ==
      (pointer)0x0) {
    args_4 = (ParameterValueAssignmentSyntax *)0x0;
  }
  else {
    args_4 = deepClone<slang::syntax::ParameterValueAssignmentSyntax>
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  deepClone<slang::syntax::HierarchicalInstanceSyntax>(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  pHVar1 = BumpAllocator::
           emplace<slang::syntax::HierarchyInstantiationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ParameterValueAssignmentSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>&,slang::parsing::Token>
                     (unaff_retaddr,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      (Token *)__child_stack,(ParameterValueAssignmentSyntax **)TVar2.info,
                      TVar2._0_8_,(Token *)args_4);
  return (int)pHVar1;
}

Assistant:

static SyntaxNode* clone(const HierarchyInstantiationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<HierarchyInstantiationSyntax>(
        *deepClone(node.attributes, alloc),
        node.type.deepClone(alloc),
        node.parameters ? deepClone(*node.parameters, alloc) : nullptr,
        *deepClone(node.instances, alloc),
        node.semi.deepClone(alloc)
    );
}